

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O2

FloatFormat * tcu::FloatFormat::nativeDouble(void)

{
  FloatFormat *in_RDI;
  
  FloatFormat(in_RDI,-0x3fe,0x3ff,0x34,true,YES,YES,YES);
  return in_RDI;
}

Assistant:

FloatFormat	FloatFormat::nativeDouble (void)
{
	return nativeFormat<double>();
}